

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O2

Memslot __thiscall bsplib::Rdma::lookup_reg(Rdma *this,void *addr,bool pushed,bool popped)

{
  uint uVar1;
  pointer pMVar2;
  const_iterator cVar3;
  Memslot MVar4;
  long lVar5;
  void *local_20;
  
  if (addr == (void *)0x0) {
    return 0xfffffffffffffffe;
  }
  MVar4 = this->m_cached_slot;
  if (MVar4 != 0xffffffffffffffff) {
    lVar5 = (long)this->m_nprocs * MVar4;
    pMVar2 = (this->m_used_slots).
             super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pMVar2[lVar5 + this->m_pid].addr == addr) && (pMVar2[lVar5 + this->m_pid].status == 0)) {
      return MVar4;
    }
  }
  local_20 = addr;
  cVar3 = std::
          _Hashtable<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_register)._M_h,&local_20);
  MVar4 = 0xffffffffffffffff;
  if (cVar3.
      super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    lVar5 = (long)cVar3.
                  super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                  ._M_cur + 0x10;
    do {
      if (lVar5 == *(long *)((long)cVar3.
                                   super__Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                                   ._M_cur + 0x10)) {
        return 0xffffffffffffffff;
      }
      lVar5 = *(long *)(lVar5 + 8);
      MVar4 = *(Memslot *)(lVar5 + 0x10);
      uVar1 = (this->m_used_slots).
              super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
              _M_impl.super__Vector_impl_data._M_start
              [(long)this->m_pid + MVar4 * (long)this->m_nprocs].status;
      if (uVar1 == 0) {
        this->m_cached_slot = MVar4;
        return MVar4;
      }
    } while (((bool)((byte)uVar1 & 1) != pushed) || (((uVar1 & 2) == 0) == popped));
  }
  return MVar4;
}

Assistant:

Memslot lookup_reg( const void * addr, bool pushed, bool popped ) const
    {   
        if (addr == NULL ) return null_slot();
        
        if ( m_cached_slot != no_slot() 
                && slot( m_pid, m_cached_slot).addr == addr
                && slot( m_pid, m_cached_slot).status == Memblock::NORMAL )
            return m_cached_slot;

        Reg::const_iterator i = m_register.find( const_cast<void*>(addr) );
        if (i != m_register.end()) {
            for (RRSIt j = i->second.rbegin(); j != i->second.rend(); ++j) {
                unsigned status  = slot( m_pid, *j ).status ;
                if ( status == unsigned(Memblock::NORMAL))  {
                    m_cached_slot = *j;
                    return m_cached_slot;
                }
                if ( pushed == bool (status & Memblock::PUSHED)
                  &&  popped == bool (status & Memblock::POPPED)) {
                    return *j;
                }
                             
            }
        }
        return no_slot(); 
    }